

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O3

Scale * icu_63::number::Scale::byDouble(Scale *__return_storage_ptr__,double multiplicand)

{
  DecNum *this;
  UErrorCode *in_RSI;
  DecNum *p;
  UErrorCode localError;
  UErrorCode local_24;
  DecNum *local_20;
  double local_18;
  
  local_24 = U_ZERO_ERROR;
  local_18 = multiplicand;
  this = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)in_RSI);
  if (this == (DecNum *)0x0) {
    local_24 = U_MEMORY_ALLOCATION_ERROR;
    __return_storage_ptr__->fMagnitude = 0;
    __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
    __return_storage_ptr__->fError = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    impl::DecNum::DecNum(this);
    in_RSI = &local_24;
    local_20 = this;
    impl::DecNum::setTo(this,local_18,in_RSI);
    if (U_ZERO_ERROR < local_24) {
      __return_storage_ptr__->fMagnitude = 0;
      __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
      __return_storage_ptr__->fError = local_24;
      MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray
                ((MaybeStackHeaderAndArray<decNumber,_char,_34> *)this);
      goto LAB_0025ce20;
    }
    local_20 = (DecNum *)0x0;
    in_RSI = (UErrorCode *)0x0;
    Scale(__return_storage_ptr__,0,this);
  }
  this = (DecNum *)0x0;
LAB_0025ce20:
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDouble(double multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}